

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-quants.c
# Opt level: O3

void ggml_vec_dot_tq1_0_q8_K(int n,float *s,size_t bs,void *vx,size_t bx,void *vy,size_t by,int nrc)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  long lVar6;
  block_q8_K *y;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar12 [32];
  
  fVar17 = 0.0;
  fVar19 = 0.0;
  fVar13 = 0.0;
  fVar15 = 0.0;
  fVar21 = 0.0;
  fVar23 = 0.0;
  fVar25 = 0.0;
  fVar27 = 0.0;
  fVar14 = 0.0;
  fVar16 = 0.0;
  fVar18 = 0.0;
  fVar20 = 0.0;
  fVar22 = 0.0;
  fVar24 = 0.0;
  fVar26 = 0.0;
  fVar28 = 0.0;
  if (0xff < n) {
    auVar10[8] = 3;
    auVar10._0_8_ = 0x303030303030303;
    auVar10[9] = 3;
    auVar10[10] = 3;
    auVar10[0xb] = 3;
    auVar10[0xc] = 3;
    auVar10[0xd] = 3;
    auVar10[0xe] = 3;
    auVar10[0xf] = 3;
    auVar10[0x10] = 3;
    auVar10[0x11] = 3;
    auVar10[0x12] = 3;
    auVar10[0x13] = 3;
    auVar10[0x14] = 3;
    auVar10[0x15] = 3;
    auVar10[0x16] = 3;
    auVar10[0x17] = 3;
    auVar10[0x18] = 3;
    auVar10[0x19] = 3;
    auVar10[0x1a] = 3;
    auVar10[0x1b] = 3;
    auVar10[0x1c] = 3;
    auVar10[0x1d] = 3;
    auVar10[0x1e] = 3;
    auVar10[0x1f] = 3;
    auVar11[8] = 0xf8;
    auVar11._0_8_ = 0xf8f8f8f8f8f8f8f8;
    auVar11[9] = 0xf8;
    auVar11[10] = 0xf8;
    auVar11[0xb] = 0xf8;
    auVar11[0xc] = 0xf8;
    auVar11[0xd] = 0xf8;
    auVar11[0xe] = 0xf8;
    auVar11[0xf] = 0xf8;
    auVar12[0x10] = 0xf8;
    auVar12._0_16_ = auVar11;
    auVar12[0x11] = 0xf8;
    auVar12[0x12] = 0xf8;
    auVar12[0x13] = 0xf8;
    auVar12[0x14] = 0xf8;
    auVar12[0x15] = 0xf8;
    auVar12[0x16] = 0xf8;
    auVar12[0x17] = 0xf8;
    auVar12[0x18] = 0xf8;
    auVar12[0x19] = 0xf8;
    auVar12[0x1a] = 0xf8;
    auVar12[0x1b] = 0xf8;
    auVar12[0x1c] = 0xf8;
    auVar12[0x1d] = 0xf8;
    auVar12[0x1e] = 0xf8;
    auVar12[0x1f] = 0xf8;
    auVar29[8] = 1;
    auVar29._0_8_ = 0x101010101010101;
    auVar29[9] = 1;
    auVar29[10] = 1;
    auVar29[0xb] = 1;
    auVar29[0xc] = 1;
    auVar29[0xd] = 1;
    auVar29[0xe] = 1;
    auVar29[0xf] = 1;
    auVar29[0x10] = 1;
    auVar29[0x11] = 1;
    auVar29[0x12] = 1;
    auVar29[0x13] = 1;
    auVar29[0x14] = 1;
    auVar29[0x15] = 1;
    auVar29[0x16] = 1;
    auVar29[0x17] = 1;
    auVar29[0x18] = 1;
    auVar29[0x19] = 1;
    auVar29[0x1a] = 1;
    auVar29[0x1b] = 1;
    auVar29[0x1c] = 1;
    auVar29[0x1d] = 1;
    auVar29[0x1e] = 1;
    auVar29[0x1f] = 1;
    auVar3 = vpmovsxbw_avx2(_DAT_00173840);
    auVar30._8_2_ = 0xff;
    auVar30._0_8_ = 0xff00ff00ff00ff;
    auVar30._10_2_ = 0xff;
    auVar30._12_2_ = 0xff;
    auVar30._14_2_ = 0xff;
    auVar30._16_2_ = 0xff;
    auVar30._18_2_ = 0xff;
    auVar30._20_2_ = 0xff;
    auVar30._22_2_ = 0xff;
    auVar30._24_2_ = 0xff;
    auVar30._26_2_ = 0xff;
    auVar30._28_2_ = 0xff;
    auVar30._30_2_ = 0xff;
    auVar31._8_2_ = 1;
    auVar31._0_8_ = 0x1000100010001;
    auVar31._10_2_ = 1;
    auVar31._12_2_ = 1;
    auVar31._14_2_ = 1;
    auVar31._16_2_ = 1;
    auVar31._18_2_ = 1;
    auVar31._20_2_ = 1;
    auVar31._22_2_ = 1;
    auVar31._24_2_ = 1;
    auVar31._26_2_ = 1;
    auVar31._28_2_ = 1;
    auVar31._30_2_ = 1;
    lVar6 = 0;
    do {
      auVar2 = *(undefined1 (*) [32])((long)vx + lVar6);
      lVar5 = lVar6 + 0x34;
      auVar33 = vpaddb_avx2(auVar2,auVar2);
      auVar35 = vpsllw_avx2(auVar2,3);
      auVar33 = vpaddb_avx2(auVar33,auVar2);
      auVar35 = vpand_avx2(auVar35,auVar12);
      auVar36 = vpsllw_avx2(auVar33,3);
      auVar35 = vpaddb_avx2(auVar35,auVar2);
      auVar32 = vpsubusb_avx2(auVar2,auVar29);
      auVar2 = vpand_avx2(auVar36,auVar12);
      auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar36 = vpavgb_avx2(auVar32,auVar9);
      auVar38 = vpsllw_avx2(auVar35,3);
      auVar2 = vpaddb_avx2(auVar2,auVar33);
      auVar39 = vpsubusb_avx2(auVar33,auVar29);
      auVar36 = vpavgb_avx2(auVar32,auVar36);
      auVar33 = vpand_avx2(auVar38,auVar12);
      auVar32 = vpavgb_avx2(auVar39,auVar9);
      auVar36 = vpsrlw_avx2(auVar36,6);
      auVar33 = vpaddb_avx2(auVar33,auVar35);
      auVar38 = vpsubusb_avx2(auVar35,auVar29);
      auVar4 = vpsubusb_avx2(auVar2,auVar29);
      auVar35 = vpavgb_avx2(auVar39,auVar32);
      auVar2 = vpand_avx2(auVar36,auVar10);
      auVar36 = vpmaddubsw_avx2(auVar2,*(undefined1 (*) [32])((long)vy + 4));
      auVar2 = vpavgb_avx2(auVar38,auVar9);
      auVar39 = vpsubusb_avx2(auVar33,auVar29);
      auVar32 = vpsrlw_avx2(auVar35,6);
      auVar33 = vpavgb_avx2(auVar38,auVar2);
      auVar35 = vpavgb_avx2(auVar4,auVar9);
      auVar2 = vpand_avx2(auVar32,auVar10);
      auVar32 = vpmaddubsw_avx2(auVar2,*(undefined1 (*) [32])((long)vy + 0x24));
      auVar38 = vpsrlw_avx2(auVar33,6);
      auVar2 = vpavgb_avx2(auVar4,auVar35);
      auVar33 = vpavgb_avx2(auVar39,auVar9);
      auVar35 = vpsrlw_avx2(auVar2,6);
      auVar2 = vpavgb_avx2(auVar39,auVar33);
      auVar39 = vpsrlw_avx2(auVar2,6);
      auVar2 = vpaddw_avx2(auVar32,auVar36);
      auVar33 = vpand_avx2(auVar38,auVar10);
      auVar33 = vpmaddubsw_avx2(auVar33,*(undefined1 (*) [32])((long)vy + 0x44));
      uVar1 = *(undefined4 *)((long)vx + lVar6 + 0x30);
      auVar34._4_4_ = uVar1;
      auVar34._0_4_ = uVar1;
      auVar34._8_4_ = uVar1;
      auVar34._12_4_ = uVar1;
      auVar36 = vpmovzxbw_avx2(auVar34);
      auVar2 = vpaddw_avx2(auVar2,auVar33);
      auVar33 = vpand_avx2(auVar35,auVar10);
      auVar35 = vpmaddubsw_avx2(auVar33,*(undefined1 (*) [32])((long)vy + 100));
      auVar33 = vpmullw_avx2(auVar36,auVar3);
      auVar33 = vpand_avx2(auVar33,auVar30);
      auVar7 = vpackuswb_avx(auVar33._0_16_,auVar33._16_16_);
      auVar2 = vpaddw_avx2(auVar2,auVar35);
      auVar33 = vpand_avx2(auVar39,auVar10);
      auVar33 = vpmaddubsw_avx2(auVar33,*(undefined1 (*) [32])((long)vy + 0x84));
      auVar2 = vpaddw_avx2(auVar2,auVar33);
      auVar34 = *(undefined1 (*) [16])((long)vx + lVar6 + 0x20);
      lVar6 = lVar6 + 0x36;
      auVar8 = vpaddb_avx(auVar34,auVar34);
      auVar37 = vpsllw_avx(auVar34,3);
      auVar8 = vpaddb_avx(auVar8,auVar34);
      auVar37 = vpand_avx(auVar37,auVar11);
      auVar40 = vpsllw_avx(auVar8,3);
      auVar37 = vpaddb_avx(auVar37,auVar34);
      auVar33._0_16_ = ZEXT116(0) * auVar8 + ZEXT116(1) * auVar34;
      auVar33._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar8;
      auVar34 = vpand_avx(auVar40,auVar11);
      auVar40 = vpsllw_avx(auVar37,3);
      auVar35 = vpsubusb_avx2(auVar33,auVar29);
      auVar34 = vpaddb_avx(auVar34,auVar8);
      auVar8 = vpand_avx(auVar40,auVar11);
      auVar36._0_16_ = ZEXT116(0) * auVar34 + ZEXT116(1) * auVar37;
      auVar36._16_16_ = ZEXT116(1) * auVar34;
      auVar34 = vpaddb_avx(auVar8,auVar37);
      auVar33 = vpavgb_avx2(auVar35,auVar9);
      auVar36 = vpsubusb_avx2(auVar36,auVar29);
      auVar33 = vpavgb_avx2(auVar35,auVar33);
      auVar32._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar34;
      auVar32._16_16_ = ZEXT116(1) * auVar7;
      auVar35 = vpavgb_avx2(auVar36,auVar9);
      auVar33 = vpsrlw_avx2(auVar33,6);
      auVar32 = vpsubusb_avx2(auVar32,auVar29);
      auVar35 = vpavgb_avx2(auVar36,auVar35);
      auVar33 = vpand_avx2(auVar33,auVar10);
      auVar36 = vpmaddubsw_avx2(auVar33,*(undefined1 (*) [32])((long)vy + 0xa4));
      auVar33 = vpavgb_avx2(auVar32,auVar9);
      auVar39 = vpsrlw_avx2(auVar35,6);
      auVar35 = vpavgb_avx2(auVar32,auVar33);
      auVar33 = vpand_avx2(auVar39,auVar10);
      auVar33 = vpmaddubsw_avx2(auVar33,*(undefined1 (*) [32])((long)vy + 0xc4));
      auVar35 = vpsrlw_avx2(auVar35,6);
      auVar33 = vpaddw_avx2(auVar36,auVar33);
      auVar2 = vpaddw_avx2(auVar2,auVar33);
      auVar33 = vpand_avx2(auVar35,auVar10);
      auVar33 = vpmaddubsw_avx2(auVar33,*(undefined1 (*) [32])((long)vy + 0xe4));
      auVar2 = vpaddw_avx2(auVar2,auVar33);
      auVar2 = vpsubw_avx2(auVar2,*(undefined1 (*) [32])((long)vy + 0x104));
      fVar14 = *vy;
      vy = (void *)((long)vy + 0x124);
      fVar14 = fVar14 * *(float *)(&ggml_table_f32_f16 + (ulong)*(ushort *)((long)vx + lVar5) * 4);
      auVar2 = vpmaddwd_avx2(auVar2,auVar31);
      auVar2 = vcvtdq2ps_avx(auVar2);
      fVar13 = fVar14 * auVar2._0_4_ + fVar13;
      fVar15 = fVar14 * auVar2._4_4_ + fVar15;
      fVar17 = fVar14 * auVar2._8_4_ + fVar17;
      fVar19 = fVar14 * auVar2._12_4_ + fVar19;
      fVar21 = fVar14 * auVar2._16_4_ + fVar21;
      fVar23 = fVar14 * auVar2._20_4_ + fVar23;
      fVar25 = fVar14 * auVar2._24_4_ + fVar25;
      fVar27 = auVar2._28_4_ + fVar27;
      fVar14 = fVar13;
      fVar16 = fVar15;
      fVar18 = fVar17;
      fVar20 = fVar19;
      fVar22 = fVar21;
      fVar24 = fVar23;
      fVar26 = fVar25;
      fVar28 = fVar27;
    } while ((ulong)((uint)n >> 8) * 0x36 - lVar6 != 0);
  }
  auVar7._0_4_ = fVar22 + fVar14;
  auVar7._4_4_ = fVar24 + fVar16;
  auVar7._8_4_ = fVar26 + fVar18;
  auVar7._12_4_ = fVar28 + fVar20;
  auVar11 = vshufpd_avx(auVar7,auVar7,1);
  auVar8._0_4_ = auVar7._0_4_ + auVar11._0_4_;
  auVar8._4_4_ = auVar7._4_4_ + auVar11._4_4_;
  auVar8._8_4_ = auVar7._8_4_ + auVar11._8_4_;
  auVar8._12_4_ = auVar7._12_4_ + auVar11._12_4_;
  auVar11 = vhaddps_avx(auVar8,auVar8);
  *s = auVar11._0_4_;
  return;
}

Assistant:

void ggml_vec_dot_tq1_0_q8_K(int n, float * GGML_RESTRICT s, size_t bs, const void * GGML_RESTRICT vx, size_t bx, const void * GGML_RESTRICT vy, size_t by, int nrc) {
    assert(nrc == 1);
    UNUSED(nrc);
    UNUSED(bx);
    UNUSED(by);
    UNUSED(bs);

    const block_tq1_0 * GGML_RESTRICT x = vx;
    const block_q8_K  * GGML_RESTRICT y = vy;

    const int nb = n / QK_K;

#if defined(__ARM_NEON)
    float sumf = 0.0f;

    uint8_t k_shift[16] = {1, 1, 1, 1, 3, 3, 3, 3, 9, 9, 9, 9, 27, 27, 27, 27};

    const uint8x16_t shift = vld1q_u8(k_shift);

    for (int i = 0; i < nb; ++i) {
#if defined(__ARM_FEATURE_DOTPROD)
        int32x4_t sumi0 = vdupq_n_s32(0);
        int32x4_t sumi1 = vdupq_n_s32(0);
#else
        int16x8_t sumi0 = vdupq_n_s16(0);
        int16x8_t sumi1 = vdupq_n_s16(0);
#endif

        // first 32 bytes of 5 elements
        {
            uint8x16_t qx0 = vld1q_u8(x[i].qs + 0);
            uint8x16_t qx1 = vld1q_u8(x[i].qs + 16);
            uint8x16_t qx2 = vmulq_u8(qx0, vdupq_n_u8(3));
            uint8x16_t qx3 = vmulq_u8(qx1, vdupq_n_u8(3));
            uint8x16_t qx4 = vmulq_u8(qx0, vdupq_n_u8(9));
            uint8x16_t qx5 = vmulq_u8(qx1, vdupq_n_u8(9));
            uint8x16_t qx6 = vmulq_u8(qx0, vdupq_n_u8(27));
            uint8x16_t qx7 = vmulq_u8(qx1, vdupq_n_u8(27));
            uint8x16_t qx8 = vmulq_u8(qx0, vdupq_n_u8(81));
            uint8x16_t qx9 = vmulq_u8(qx1, vdupq_n_u8(81));

            // multiply by 3 and keep the 2 bits above 8 bits
            int8x16_t sqx0 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx0, vshrq_n_u8(qx0, 1)), 6));
            int8x16_t sqx1 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx1, vshrq_n_u8(qx1, 1)), 6));
            int8x16_t sqx2 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx2, vshrq_n_u8(qx2, 1)), 6));
            int8x16_t sqx3 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx3, vshrq_n_u8(qx3, 1)), 6));
            int8x16_t sqx4 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx4, vshrq_n_u8(qx4, 1)), 6));
            int8x16_t sqx5 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx5, vshrq_n_u8(qx5, 1)), 6));
            int8x16_t sqx6 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx6, vshrq_n_u8(qx6, 1)), 6));
            int8x16_t sqx7 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx7, vshrq_n_u8(qx7, 1)), 6));
            int8x16_t sqx8 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx8, vshrq_n_u8(qx8, 1)), 6));
            int8x16_t sqx9 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx9, vshrq_n_u8(qx9, 1)), 6));

            const int8x16_t qy0 = vld1q_s8(y[i].qs +   0);
            const int8x16_t qy1 = vld1q_s8(y[i].qs +  16);
            const int8x16_t qy2 = vld1q_s8(y[i].qs +  32);
            const int8x16_t qy3 = vld1q_s8(y[i].qs +  48);
            const int8x16_t qy4 = vld1q_s8(y[i].qs +  64);
            const int8x16_t qy5 = vld1q_s8(y[i].qs +  80);
            const int8x16_t qy6 = vld1q_s8(y[i].qs +  96);
            const int8x16_t qy7 = vld1q_s8(y[i].qs + 112);
            const int8x16_t qy8 = vld1q_s8(y[i].qs + 128);
            const int8x16_t qy9 = vld1q_s8(y[i].qs + 144);

#if defined(__ARM_FEATURE_DOTPROD)
            sumi0 = vdotq_s32(sumi0, sqx0, qy0);
            sumi1 = vdotq_s32(sumi1, sqx1, qy1);
            sumi0 = vdotq_s32(sumi0, sqx2, qy2);
            sumi1 = vdotq_s32(sumi1, sqx3, qy3);
            sumi0 = vdotq_s32(sumi0, sqx4, qy4);
            sumi1 = vdotq_s32(sumi1, sqx5, qy5);
            sumi0 = vdotq_s32(sumi0, sqx6, qy6);
            sumi1 = vdotq_s32(sumi1, sqx7, qy7);
            sumi0 = vdotq_s32(sumi0, sqx8, qy8);
            sumi1 = vdotq_s32(sumi1, sqx9, qy9);
#else
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx0), vget_low_s8(qy0));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx0), vget_high_s8(qy0));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx1), vget_low_s8(qy1));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx1), vget_high_s8(qy1));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx2), vget_low_s8(qy2));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx2), vget_high_s8(qy2));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx3), vget_low_s8(qy3));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx3), vget_high_s8(qy3));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx4), vget_low_s8(qy4));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx4), vget_high_s8(qy4));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx5), vget_low_s8(qy5));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx5), vget_high_s8(qy5));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx6), vget_low_s8(qy6));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx6), vget_high_s8(qy6));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx7), vget_low_s8(qy7));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx7), vget_high_s8(qy7));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx8), vget_low_s8(qy8));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx8), vget_high_s8(qy8));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx9), vget_low_s8(qy9));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx9), vget_high_s8(qy9));
#endif
        }

        // last 16 bytes of 5-element, along with the 4 bytes of 4 elements
        {
            uint8x16_t qx0 = vld1q_u8(x[i].qs + 32);
            uint8x16_t qx1 = vmulq_u8(qx0, vdupq_n_u8(3));
            uint8x16_t qx2 = vmulq_u8(qx0, vdupq_n_u8(9));
            uint8x16_t qx3 = vmulq_u8(qx0, vdupq_n_u8(27));
            uint8x16_t qx4 = vmulq_u8(qx0, vdupq_n_u8(81));
            uint32_t qh;
            memcpy(&qh, x[i].qh, sizeof(qh)); // potentially unaligned
            uint8x16_t qx5 = vreinterpretq_u8_u32(vdupq_n_u32(qh));
            qx5 = vmulq_u8(qx5, shift);

            // multiply by 3 and keep the 2 bits above 8 bits
            int8x16_t sqx0 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx0, vshrq_n_u8(qx0, 1)), 6));
            int8x16_t sqx1 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx1, vshrq_n_u8(qx1, 1)), 6));
            int8x16_t sqx2 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx2, vshrq_n_u8(qx2, 1)), 6));
            int8x16_t sqx3 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx3, vshrq_n_u8(qx3, 1)), 6));
            int8x16_t sqx4 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx4, vshrq_n_u8(qx4, 1)), 6));
            int8x16_t sqx5 = vreinterpretq_s8_u8(vshrq_n_u8(vhaddq_u8(qx5, vshrq_n_u8(qx5, 1)), 6));

            const int8x16_t qy0 = vld1q_s8(y[i].qs + 160);
            const int8x16_t qy1 = vld1q_s8(y[i].qs + 176);
            const int8x16_t qy2 = vld1q_s8(y[i].qs + 192);
            const int8x16_t qy3 = vld1q_s8(y[i].qs + 208);
            const int8x16_t qy4 = vld1q_s8(y[i].qs + 224);
            const int8x16_t qy5 = vld1q_s8(y[i].qs + 240);

#if defined(__ARM_FEATURE_DOTPROD)
            sumi0 = vdotq_s32(sumi0, sqx0, qy0);
            sumi1 = vdotq_s32(sumi1, sqx1, qy1);
            sumi0 = vdotq_s32(sumi0, sqx2, qy2);
            sumi1 = vdotq_s32(sumi1, sqx3, qy3);
            sumi0 = vdotq_s32(sumi0, sqx4, qy4);
            sumi1 = vdotq_s32(sumi1, sqx5, qy5);
#else
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx0), vget_low_s8(qy0));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx0), vget_high_s8(qy0));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx1), vget_low_s8(qy1));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx1), vget_high_s8(qy1));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx2), vget_low_s8(qy2));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx2), vget_high_s8(qy2));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx3), vget_low_s8(qy3));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx3), vget_high_s8(qy3));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx4), vget_low_s8(qy4));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx4), vget_high_s8(qy4));
            sumi0 = vmlal_s8(sumi0, vget_low_s8(sqx5), vget_low_s8(qy5));
            sumi1 = vmlal_s8(sumi1, vget_high_s8(sqx5), vget_high_s8(qy5));
#endif
        }

        const int16x8_t ysum0 = vld1q_s16(y[i].bsums);
        const int16x8_t ysum1 = vld1q_s16(y[i].bsums + 8);

        const float d = GGML_FP16_TO_FP32(x[i].d) * y[i].d;

#if defined(__ARM_FEATURE_DOTPROD)
        sumi0 = vaddq_s32(sumi0, sumi1);
        sumi0 = vsubq_s32(sumi0, vpaddlq_s16(vaddq_s16(ysum0, ysum1)));

        sumf += d * (float) vaddvq_s32(sumi0);
#else
        sumi0 = vaddq_s16(sumi0, sumi1);
        sumi0 = vsubq_s16(sumi0, vaddq_s16(ysum0, ysum1));

        sumf += d * (float) vaddlvq_s16(sumi0);
#endif
    }

    *s = sumf;

#elif defined(__AVX2__)
    __m256 sumf = _mm256_setzero_ps();

    for (int i = 0; i < nb; ++i) {
        // 16-bit sums
        __m256i sumi0 = _mm256_setzero_si256();
        __m256i sumi1 = _mm256_setzero_si256();
        __m256i sumi2 = _mm256_setzero_si256();

        // first 32 bytes of 5 elements
        {
            __m256i qx0 = _mm256_loadu_si256((const __m256i *) (x[i].qs));
            // 8-bit multiplies with shifts, masks and adds
            __m256i qx1 = _mm256_add_epi8(qx0, _mm256_add_epi8(qx0, qx0)); // 1 * 3
            __m256i qx2 = _mm256_add_epi8(_mm256_and_si256(_mm256_slli_epi16(qx0, 3), _mm256_set1_epi8(-8)), qx0); // 1 * 9
            __m256i qx3 = _mm256_add_epi8(_mm256_and_si256(_mm256_slli_epi16(qx1, 3), _mm256_set1_epi8(-8)), qx1); // 3 * 9
            __m256i qx4 = _mm256_add_epi8(_mm256_and_si256(_mm256_slli_epi16(qx2, 3), _mm256_set1_epi8(-8)), qx2); // 9 * 9

            // TODO: can _mm256_mulhi_epu16 be faster even if 16-bits?

            // Cancel the +1 from avg so that it behaves like a halving add
            qx0 = _mm256_subs_epu8(qx0, _mm256_set1_epi8(1));
            qx1 = _mm256_subs_epu8(qx1, _mm256_set1_epi8(1));
            qx2 = _mm256_subs_epu8(qx2, _mm256_set1_epi8(1));
            qx3 = _mm256_subs_epu8(qx3, _mm256_set1_epi8(1));
            qx4 = _mm256_subs_epu8(qx4, _mm256_set1_epi8(1));
            // Multiply by 3 and get the top 2 bits
            qx0 = _mm256_avg_epu8(qx0, _mm256_avg_epu8(qx0, _mm256_setzero_si256()));
            qx1 = _mm256_avg_epu8(qx1, _mm256_avg_epu8(qx1, _mm256_setzero_si256()));
            qx2 = _mm256_avg_epu8(qx2, _mm256_avg_epu8(qx2, _mm256_setzero_si256()));
            qx3 = _mm256_avg_epu8(qx3, _mm256_avg_epu8(qx3, _mm256_setzero_si256()));
            qx4 = _mm256_avg_epu8(qx4, _mm256_avg_epu8(qx4, _mm256_setzero_si256()));
            qx0 = _mm256_and_si256(_mm256_srli_epi16(qx0, 6), _mm256_set1_epi8(3));
            qx1 = _mm256_and_si256(_mm256_srli_epi16(qx1, 6), _mm256_set1_epi8(3));
            qx2 = _mm256_and_si256(_mm256_srli_epi16(qx2, 6), _mm256_set1_epi8(3));
            qx3 = _mm256_and_si256(_mm256_srli_epi16(qx3, 6), _mm256_set1_epi8(3));
            qx4 = _mm256_and_si256(_mm256_srli_epi16(qx4, 6), _mm256_set1_epi8(3));

            const __m256i qy0 = _mm256_loadu_si256((const __m256i *) (y[i].qs +   0));
            const __m256i qy1 = _mm256_loadu_si256((const __m256i *) (y[i].qs +  32));
            const __m256i qy2 = _mm256_loadu_si256((const __m256i *) (y[i].qs +  64));
            const __m256i qy3 = _mm256_loadu_si256((const __m256i *) (y[i].qs +  96));
            const __m256i qy4 = _mm256_loadu_si256((const __m256i *) (y[i].qs + 128));

            qx0 = _mm256_maddubs_epi16(qx0, qy0);
            qx1 = _mm256_maddubs_epi16(qx1, qy1);
            qx2 = _mm256_maddubs_epi16(qx2, qy2);
            qx3 = _mm256_maddubs_epi16(qx3, qy3);
            qx4 = _mm256_maddubs_epi16(qx4, qy4);

            sumi0 = _mm256_add_epi16(sumi0, _mm256_add_epi16(qx0, qx1));
            sumi1 = _mm256_add_epi16(sumi1, _mm256_add_epi16(qx2, qx3));
            sumi2 = _mm256_add_epi16(sumi2, qx4);
        }

        // last 16 bytes of 5-element, along with the 4 bytes of 4 elements
        {
            __m128i qx0 = _mm_loadu_si128((const __m128i *) (x[i].qs + 32));
            uint32_t qh;
            memcpy(&qh, x[i].qh, sizeof(qh)); // potentially unaligned
            __m256i qx5_l = _mm256_cvtepu8_epi16(_mm_set1_epi32(qh));
            __m128i qx1 = _mm_add_epi8(qx0, _mm_add_epi8(qx0, qx0)); // 1 * 3
            __m128i qx2 = _mm_add_epi8(_mm_and_si128(_mm_slli_epi16(qx0, 3), _mm_set1_epi8(-8)), qx0); // 1 * 9
            __m128i qx3 = _mm_add_epi8(_mm_and_si128(_mm_slli_epi16(qx1, 3), _mm_set1_epi8(-8)), qx1); // 3 * 9
            __m128i qx4 = _mm_add_epi8(_mm_and_si128(_mm_slli_epi16(qx2, 3), _mm_set1_epi8(-8)), qx2); // 9 * 9
            __m256i qx01 = MM256_SET_M128I(qx1, qx0);
            __m256i qx23 = MM256_SET_M128I(qx3, qx2);

            // avx2 does not have 8-bit multiplies, so 16-bit it is.
            qx5_l = _mm256_mullo_epi16(qx5_l, _mm256_set_epi16(27, 27, 27, 27, 9, 9, 9, 9, 3, 3, 3, 3, 1, 1, 1, 1));
            qx5_l = _mm256_and_si256(qx5_l, _mm256_set1_epi16(0xFF));
            __m128i qx5 = _mm_packus_epi16(_mm256_castsi256_si128(qx5_l), _mm256_extracti128_si256(qx5_l, 1));

            __m256i qx45 = MM256_SET_M128I(qx5, qx4);

            // Cancel the +1 from avg so that it behaves like a halving add
            qx01 = _mm256_subs_epu8(qx01, _mm256_set1_epi8(1));
            qx23 = _mm256_subs_epu8(qx23, _mm256_set1_epi8(1));
            qx45 = _mm256_subs_epu8(qx45, _mm256_set1_epi8(1));
            // Multiply by 3 and get the top 2 bits
            qx01 = _mm256_avg_epu8(qx01, _mm256_avg_epu8(qx01, _mm256_setzero_si256()));
            qx23 = _mm256_avg_epu8(qx23, _mm256_avg_epu8(qx23, _mm256_setzero_si256()));
            qx45 = _mm256_avg_epu8(qx45, _mm256_avg_epu8(qx45, _mm256_setzero_si256()));
            qx01 = _mm256_and_si256(_mm256_srli_epi16(qx01, 6), _mm256_set1_epi8(3));
            qx23 = _mm256_and_si256(_mm256_srli_epi16(qx23, 6), _mm256_set1_epi8(3));
            qx45 = _mm256_and_si256(_mm256_srli_epi16(qx45, 6), _mm256_set1_epi8(3));

            const __m256i qy01 = _mm256_loadu_si256((const __m256i *) (y[i].qs + 160));
            const __m256i qy23 = _mm256_loadu_si256((const __m256i *) (y[i].qs + 192));
            const __m256i qy45 = _mm256_loadu_si256((const __m256i *) (y[i].qs + 224));

            qx01 = _mm256_maddubs_epi16(qx01, qy01);
            qx23 = _mm256_maddubs_epi16(qx23, qy23);
            qx45 = _mm256_maddubs_epi16(qx45, qy45);

            sumi0 = _mm256_add_epi16(sumi0, qx01);
            sumi1 = _mm256_add_epi16(sumi1, qx23);
            sumi2 = _mm256_add_epi16(sumi2, qx45);
        }

        const __m256i ysum = _mm256_loadu_si256((const __m256i *) y[i].bsums);
        const __m256 d = _mm256_set1_ps(y[i].d * GGML_FP16_TO_FP32(x[i].d));

        sumi0 = _mm256_sub_epi16(sumi0, ysum);
        sumi0 = _mm256_add_epi16(sumi0, _mm256_add_epi16(sumi1, sumi2));
        sumi0 = _mm256_madd_epi16(sumi0, _mm256_set1_epi16(1));

        sumf = _mm256_add_ps(_mm256_mul_ps(_mm256_cvtepi32_ps(sumi0), d), sumf);
    }

    *s = hsum_float_8(sumf);

#else
    const uint8_t pow3[6] = {1, 3, 9, 27, 81, 243};

    float sumf = 0.0f;

    for (int i = 0; i < nb; ++i) {
        int sum = 0;

        for (size_t j = 0; j < sizeof(x->qs) - sizeof(x->qs) % 32; j += 32) {
            for (size_t l = 0; l < 5; ++l) {
                for (size_t m = 0; m < 32; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[l];
                    uint16_t xi = ((uint16_t) q * 3) >> 8;
                    sum += (xi - 1) * y[i].qs[j*5 + l*32 + m];
                }
            }
        }
        for (size_t j = sizeof(x->qs) - sizeof(x->qs) % 32; j < sizeof(x->qs); j += 16) {
            for (size_t l = 0; l < 5; ++l) {
                for (size_t m = 0; m < 16; ++m) {
                    uint8_t q = x[i].qs[j + m] * pow3[l];
                    uint16_t xi = ((uint16_t) q * 3) >> 8;
                    sum += (xi - 1) * y[i].qs[j*5 + l*16 + m];
                }
            }
        }

        for (size_t l = 0; l < 4; ++l) {
            for (size_t j = 0; j < sizeof(x->qh); ++j) {
                uint8_t q = x[i].qh[j] * pow3[l];
                uint16_t xi = ((uint16_t) q * 3) >> 8;
                sum += (xi - 1) * y[i].qs[sizeof(x->qs)*5 + l*sizeof(x->qh) + j];
            }
        }

        sumf += (float) sum * (GGML_FP16_TO_FP32(x[i].d) * y[i].d);
    }

    *s = sumf;
#endif
}